

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KFIXED.h
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED
          (KFIXED<char,_(unsigned_char)__x03_> *this)

{
  DataTypeBase::~DataTypeBase(&this->super_DataTypeBase);
  operator_delete(this,0x10);
  return;
}

Assistant:

class KDIS_EXPORT KFIXED : public DataTypeBase
{
public:

    typedef Type ValueType;

protected:

    Type m_Val;

    //************************************
    // FullName:    KDIS::DATA_TYPE::KFIXED<Type, BinaryPoint>::convert
    // Description: convert from a float to a fixed value.
    // Parameter:   KFLOAT32 V
    //************************************
    Type convert( KFLOAT32 V ) const;
    Type convert( KFLOAT64 V ) const;

public:

    KFIXED();

    KFIXED( KFLOAT32 V );

    KFIXED( KFLOAT64 V );

    KFIXED( Type V );

    KFIXED(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::KFIXED::Set
    // Description: Sets the internal value.
    // Parameter:   KFLOAT32 V
    //************************************
    void Set( KFLOAT32 V );

    //************************************
    // FullName:    KDIS::DATA_TYPE::KFIXED::Set
    // Description: Sets the internal value.
    // Parameter:   KFLOAT64 V
    //************************************
    void Set( KFLOAT64 V );

    //************************************
    // FullName:    KDIS::DATA_TYPE::KFIXED::Set
    // Description: Set the internal value.
    // Parameter:   Type V
    //************************************
    void Set( Type V );

    //************************************
    // FullName:    KDIS::DATA_TYPE::KFIXED::Get
    // Description: Returns internal value.
    //************************************
    Type Get() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::KFIXED::GetAsFloat32
    // Description: Convert value to a float 32 bit.
    //************************************
    KFLOAT32 GetAsFloat32() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::KFIXED::GetAsString
    // Description: Returns a string representation.
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::KFIXED::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::KFIXED::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;

    void Encode(KDataStream &stream) const override;

    // operators

    // Helper macros:
#define DECLARE_OPERATOR( OPERATOR )                                \
                                                                     \
 KFIXED operator OPERATOR ( KFLOAT32 Value );                        \
 KFIXED operator OPERATOR ( KFLOAT64 Value );                        \
 KFIXED operator OPERATOR ( Type Value );                            \
 KFIXED operator OPERATOR ( KFIXED<Type, BinaryPoint> Value );       \
 
#define DECLARE_COMPARISON_OPERATOR( OPERATOR )                     \
                                                                     \
 KBOOL operator OPERATOR ( KFLOAT32 Value ) const;                   \
 KBOOL operator OPERATOR ( KFLOAT64 Value ) const;                   \
 KBOOL operator OPERATOR ( Type Value ) const;                       \
 KBOOL operator OPERATOR ( KFIXED<Type, BinaryPoint> Value ) const;  \
 // End of macros

    // Supported operators
    DECLARE_OPERATOR( = )
    DECLARE_OPERATOR( + )
    DECLARE_OPERATOR( - )
    DECLARE_OPERATOR( * )
    DECLARE_OPERATOR( / )

    // Comparison operators:
    DECLARE_COMPARISON_OPERATOR( == )
    DECLARE_COMPARISON_OPERATOR( != )
    DECLARE_COMPARISON_OPERATOR( < )
    DECLARE_COMPARISON_OPERATOR( <= )
    DECLARE_COMPARISON_OPERATOR( > )
    DECLARE_COMPARISON_OPERATOR( >= )

    // We are finished with the macros now so lets remove them.
#undef DECLARE_OPERATOR
#undef DECLARE_COMPARISON_OPERATOR

    // Casting
    explicit operator KFLOAT32() const;

    explicit operator Type() const;
};

// Predefined KFIXED types.
// KFIXEDx_y
// x = Size of data type in bits
// y = The position of the binary point.
typedef KFIXED<KINT8, 3> KFIXED8_3;
typedef KFIXED<KINT16, 3> KFIXED16_3;
typedef KFIXED<KINT16, 8> KFIXED16_8;

}